

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_ManGetClpStats(Cba_Man_t *p,int *nObjs,int *nFins,int *nFons)

{
  int *pCountN;
  int *pCountI;
  int *pCountO;
  Cba_Ntk_t *p_00;
  size_t __size;
  
  __size = (long)(p->vNtks).nSize << 2;
  pCountN = (int *)malloc(__size);
  memset(pCountN,0xff,__size);
  pCountI = (int *)malloc(__size);
  memset(pCountI,0xff,__size);
  pCountO = (int *)malloc(__size);
  memset(pCountO,0xff,__size);
  p_00 = Cba_ManRoot(p);
  Cba_ManGetClpStats_rec(p_00,pCountN,pCountI,pCountO);
  *nObjs = (p_00->vOutputs).nSize + (p_00->vInputs).nSize + pCountN[p_00->Id];
  *nFins = pCountI[p_00->Id] + (p_00->vOutputs).nSize;
  *nFons = pCountO[p_00->Id] + (p_00->vInputs).nSize;
  free(pCountN);
  free(pCountI);
  free(pCountO);
  return;
}

Assistant:

void Cba_ManGetClpStats( Cba_Man_t * p, int * nObjs, int * nFins, int * nFons )
{
    int * pCountN = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    int * pCountI = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    int * pCountO = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_Ntk_t * pRoot = Cba_ManRoot(p);
    Cba_ManGetClpStats_rec( pRoot, pCountN, pCountI, pCountO );
    *nObjs = Cba_NtkPioNum(pRoot) + pCountN[Cba_NtkId(pRoot)];
    *nFins = Cba_NtkPoNum(pRoot)  + pCountI[Cba_NtkId(pRoot)];
    *nFons = Cba_NtkPiNum(pRoot)  + pCountO[Cba_NtkId(pRoot)];
    ABC_FREE( pCountN );
    ABC_FREE( pCountI );
    ABC_FREE( pCountO );
}